

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0391(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_740;
  allocator<char> local_73f;
  allocator<char> local_73e;
  allocator<char> local_73d;
  allocator<char> local_73c;
  allocator<char> local_73b;
  allocator<char> local_73a;
  allocator<char> local_739;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658 [32];
  Expectation local_638;
  Expectation local_580;
  Decl local_4c8;
  Decl local_400;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"void x ( y z [ ] , w z ) ;",&local_739);
  Expectation::Expectation(&local_638);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"x",&local_73a);
  pDVar1 = Decl::Function(&local_1a8,&local_678,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"y",&local_73b);
  pDVar1 = Ty::Typedef(pTVar2,&local_698,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,FromArrayToPointer);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"w",&local_73c);
  pDVar1 = Ty::Typedef(pTVar2,&local_6b8,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar3 = Expectation::declaration(&local_638,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"z",&local_73d);
  pDVar1 = Decl::Object(&local_338,&local_6d8,ParameterDeclaration,FunctionPrototype);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"w",&local_73e);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_6f8,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_270);
  Decl::Decl(&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"z",&local_73f);
  pDVar1 = Decl::Object(&local_4c8,&local_718,ParameterDeclaration,FunctionPrototype);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"y",&local_740);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_738,None);
  __len = 1;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,FromArrayToPointer);
  Decl::Decl(&local_400,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_400);
  Expectation::Expectation(&local_580,pEVar3);
  bind(this,(int)local_658,(sockaddr *)&local_580,__len);
  Expectation::~Expectation(&local_580);
  Decl::~Decl(&local_400);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  Decl::~Decl(&local_4c8);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_638);
  std::__cxx11::string::~string(local_658);
  return;
}

Assistant:

void DeclarationBinderTester::case0391()
{
    bind("void x ( y z [ ] , w z ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("y")
                  .ty_.atParam().Derived(TypeKind::Pointer, CVR::None, Decay::FromArrayToPointer)
                  .ty_.addParam().Typedef("w"))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("w"))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("y")
                  .ty_.Derived(TypeKind::Pointer, CVR::None, Decay::FromArrayToPointer)));
}